

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Ladder_Web.cpp
# Opt level: O3

string * handle_ladder_page_abi_cxx11_(string_view query_string)

{
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_jessilib::text_hash,_jessilib::text_equal,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  *this;
  size_t sVar1;
  undefined8 *puVar2;
  char *pcVar3;
  bool bVar4;
  unsigned_long count;
  const_iterator cVar5;
  string *psVar6;
  undefined8 *puVar7;
  LadderDatabase *db;
  basic_string_view<char,_std::char_traits<char>_> lhs;
  string_view key;
  string_view key_00;
  string_view key_01;
  basic_string_view<char,_std::char_traits<char>_> rhs;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_jessilib::text_hash,_jessilib::text_equal,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
  parsed_query;
  uint8_t local_a1;
  size_t local_a0;
  key_type local_98;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_jessilib::text_hash,_jessilib::text_equal,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
  local_88;
  
  parse_query_string_abi_cxx11_(&local_88,query_string);
  db = RenX::default_ladder_database;
  sVar1 = pluginInstance.entries_per_page;
  this = &local_88.second;
  if (local_88.second._M_h._M_element_count == 0) {
    local_a1 = 0xff;
    local_a0 = 0;
    count = pluginInstance.entries_per_page;
LAB_0010b583:
    if (db != (LadderDatabase *)0x0) {
      psVar6 = RenX_Ladder_WebPlugin::generate_ladder_page_abi_cxx11_
                         (&pluginInstance,db,local_a1,local_a0,count,this);
      goto LAB_0010b5b1;
    }
  }
  else {
    key._M_str = "format";
    key._M_len = 6;
    local_a1 = from_table_value<unsigned_char>(this,key,0xff);
    key_00._M_str = "start";
    key_00._M_len = 5;
    local_a0 = from_table_value<unsigned_long>(this,key_00,0);
    key_01._M_str = "count";
    key_01._M_len = 5;
    count = from_table_value<unsigned_long>(this,key_01,sVar1);
    local_98._M_len = 8;
    local_98._M_str = "database";
    cVar5 = std::
            _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::__detail::_Select1st,_jessilib::text_equal,_jessilib::text_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&this->_M_h,&local_98);
    if ((cVar5.
         super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_false>
         ._M_cur == (__node_type *)0x0) ||
       (sVar1 = *(size_t *)
                 ((long)cVar5.
                        super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_false>
                        ._M_cur + 0x18), sVar1 == 0)) goto LAB_0010b583;
    puVar7 = (undefined8 *)*RenX::ladder_databases;
    puVar2 = (undefined8 *)RenX::ladder_databases[1];
    if (puVar7 != puVar2) {
      pcVar3 = *(char **)((long)cVar5.
                                super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_false>
                                ._M_cur + 0x20);
      do {
        lhs = (basic_string_view<char,_std::char_traits<char>_>)RenX::LadderDatabase::getName();
        rhs._M_str = pcVar3;
        rhs._M_len = sVar1;
        bVar4 = jessilib::equalsi<char,char>(lhs,rhs);
        if (bVar4) {
          db = (LadderDatabase *)*puVar7;
          goto LAB_0010b583;
        }
        puVar7 = puVar7 + 1;
      } while (puVar7 != puVar2);
    }
  }
  psVar6 = generate_no_db_page_abi_cxx11_(this);
LAB_0010b5b1:
  std::
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::__detail::_Select1st,_jessilib::text_equal,_jessilib::text_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&this->_M_h);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.first._M_dataplus._M_p != &local_88.first.field_2) {
    operator_delete(local_88.first._M_dataplus._M_p,local_88.first.field_2._M_allocated_capacity + 1
                   );
  }
  return psVar6;
}

Assistant:

std::string* handle_ladder_page(std::string_view query_string) {
	auto parsed_query = parse_query_string(query_string);
	auto& table = parsed_query.second;
	RenX::LadderDatabase *db = RenX::default_ladder_database;
	size_t start_index = 0, count = pluginInstance.getEntriesPerPage();
	uint8_t format = 0xFF;

	if (table.size() != 0) {
		format = from_table_value<uint8_t>(table, "format"sv, format);
		start_index = from_table_value<size_t>(table, "start"sv, start_index);
		count = from_table_value<size_t>(table, "count"sv, count);
		
		std::string_view db_name = get_table_value(table, "database"sv, {});
		if (!db_name.empty()) {
			db = nullptr;
			for (const auto& database : RenX::ladder_databases) {
				if (jessilib::equalsi(std::string_view{database->getName()}, db_name)) {
					db = database;
					break;
				}
			}
		}
	}

	if (db == nullptr) {
		return generate_no_db_page(table);
	}

	return pluginInstance.generate_ladder_page(db, format, start_index, count, table);
}